

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003caf70 == '\x01') {
    DAT_003caf70 = '\0';
    (*(code *)*_NonMaximumSuppression_PickTop_default_instance_)();
  }
  if (DAT_003cafe8 == '\x01') {
    DAT_003cafe8 = 0;
    (*(code *)*_NonMaximumSuppression_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NonMaximumSuppression_PickTop_default_instance_.Shutdown();
  _NonMaximumSuppression_default_instance_.Shutdown();
}